

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

logical pnga_compare_distr(Integer g_a,Integer g_b)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int handle;
  int handle_00;
  bool bVar10;
  char err_string [256];
  char local_138 [264];
  
  handle_00 = (int)g_a + 1000;
  handle = (int)g_b + 1000;
  uVar3 = calc_maplen(handle_00);
  uVar4 = calc_maplen(handle);
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if ((g_a < -1000) || ((long)_max_global_array <= g_a + 1000)) {
    sprintf(local_138,"%s: INVALID ARRAY HANDLE","distribution a");
    pnga_error(local_138,g_a);
  }
  if (GA[g_a + 1000].actv == 0) {
    sprintf(local_138,"%s: ARRAY NOT ACTIVE","distribution a");
    pnga_error(local_138,g_a);
  }
  if ((g_b < -1000) || ((long)_max_global_array <= g_b + 1000)) {
    sprintf(local_138,"%s: INVALID ARRAY HANDLE","distribution b");
    pnga_error(local_138,g_b);
  }
  if (GA[g_b + 1000].actv == 0) {
    sprintf(local_138,"%s: ARRAY NOT ACTIVE","distribution b");
    pnga_error(local_138,g_b);
  }
  sVar1 = GA[handle_00].ndim;
  uVar7 = (uint)sVar1;
  if (sVar1 == GA[handle].ndim) {
    if (0 < sVar1) {
      uVar9 = 0;
      do {
        if (GA[handle_00].dims[uVar9] != GA[handle].dims[uVar9]) {
          return 0;
        }
        uVar9 = uVar9 + 1;
      } while (uVar7 != uVar9);
    }
    uVar2 = GA[handle_00].distr_type;
    if (uVar2 == GA[handle].distr_type) {
      if (uVar2 - 1 < 3) {
        if (0 < sVar1) {
          uVar8 = (ulong)uVar7;
          uVar9 = 0;
          do {
            if (GA[handle_00].block_dims[uVar9] != GA[handle].block_dims[uVar9]) {
              return 0;
            }
            uVar9 = uVar9 + 1;
          } while (uVar8 != uVar9);
          if (0 < sVar1) {
            uVar9 = 0;
            do {
              if (GA[handle_00].num_blocks[uVar9] != GA[handle].num_blocks[uVar9]) {
                return 0;
              }
              uVar9 = uVar9 + 1;
            } while (uVar8 != uVar9);
            if ((uVar2 & 0xfffffffe) == 2 && 0 < sVar1) {
              uVar9 = 0;
              do {
                if (GA[handle_00].nblock[uVar9] != GA[handle].nblock[uVar9]) {
                  return 0;
                }
                uVar9 = uVar9 + 1;
              } while (uVar8 != uVar9);
            }
          }
        }
      }
      else if (uVar2 == 4) {
        if (uVar3 != uVar4) {
          return 0;
        }
        if (0 < (int)uVar3) {
          lVar6 = 0;
          do {
            if (GA[handle_00].mapc[lVar6] != GA[handle].mapc[lVar6]) {
              return 0;
            }
          } while ((GA[handle_00].mapc[lVar6] != -1) &&
                  (bVar10 = (ulong)uVar3 - 1 != lVar6, lVar6 = lVar6 + 1, bVar10));
        }
        if (0 < sVar1) {
          uVar9 = 0;
          do {
            if (GA[handle_00].nblock[uVar9] != GA[handle].nblock[uVar9]) {
              return 0;
            }
            uVar9 = uVar9 + 1;
          } while (uVar7 != uVar9);
        }
      }
      else if (uVar2 == 0) {
        if (uVar3 != uVar4) {
          return 0;
        }
        if (0 < (int)uVar3) {
          lVar6 = 0;
          do {
            if (GA[handle_00].mapc[lVar6] != GA[handle].mapc[lVar6]) {
              return 0;
            }
          } while ((GA[handle_00].mapc[lVar6] != -1) &&
                  (bVar10 = (ulong)uVar3 - 1 != lVar6, lVar6 = lVar6 + 1, bVar10));
        }
      }
      lVar6 = GA[handle_00].num_rstrctd;
      if (lVar6 == GA[handle].num_rstrctd) {
        if (lVar6 < 1) {
          return 1;
        }
        lVar5 = 0;
        while (GA[handle_00].rstrctd_list[lVar5] == GA[handle].rstrctd_list[lVar5]) {
          lVar5 = lVar5 + 1;
          if (lVar6 == lVar5) {
            return 1;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

logical pnga_compare_distr(Integer g_a, Integer g_b)
{
int h_a =(int)g_a + GA_OFFSET;
int h_b =(int)g_b + GA_OFFSET;
int h_a_maplen = calc_maplen(h_a);
int h_b_maplen = calc_maplen(h_b);
int i;

   _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
   ga_check_handleM(g_a, "distribution a");
   ga_check_handleM(g_b, "distribution b");
   

   if(GA[h_a].ndim != GA[h_b].ndim) return FALSE; 

   for(i=0; i <GA[h_a].ndim; i++)
       if(GA[h_a].dims[i] != GA[h_b].dims[i]) return FALSE;

   if (GA[h_a].distr_type != GA[h_b].distr_type) return FALSE;
   if (GA[h_a].distr_type == REGULAR) {
     if (h_a_maplen != h_b_maplen) return FALSE;
     for(i=0; i <h_a_maplen; i++){
       if(GA[h_a].mapc[i] != GA[h_b].mapc[i]) return FALSE;
       if(GA[h_a].mapc[i] == -1) break;
     }
   } else if (GA[h_a].distr_type == BLOCK_CYCLIC ||
       GA[h_a].distr_type == SCALAPACK || GA[h_a].distr_type == TILED) {
     for (i=0; i<GA[h_a].ndim; i++) {
       if (GA[h_a].block_dims[i] != GA[h_b].block_dims[i]) return FALSE;
     }
     for (i=0; i<GA[h_a].ndim; i++) {
       if (GA[h_a].num_blocks[i] != GA[h_b].num_blocks[i]) return FALSE;
     }
     if (GA[h_a].distr_type == SCALAPACK || GA[h_a].distr_type == TILED) {
       for (i=0; i<GA[h_a].ndim; i++) {
         if (GA[h_a].nblock[i] != GA[h_b].nblock[i]) return FALSE;
       }
     }
   } else if (GA[h_a].distr_type == TILED_IRREG) {
     if (h_a_maplen != h_b_maplen) return FALSE;
     for(i=0; i <h_a_maplen; i++){
       if(GA[h_a].mapc[i] != GA[h_b].mapc[i]) return FALSE;
       if(GA[h_a].mapc[i] == -1) break;
     }
     for (i=0; i<GA[h_a].ndim; i++) {
       if (GA[h_a].nblock[i] != GA[h_b].nblock[i]) return FALSE;
     }
   }
   if (GA[h_a].num_rstrctd == GA[h_b].num_rstrctd) {
     if (GA[h_a].num_rstrctd > 0) {
       for (i=0; i<GA[h_a].num_rstrctd; i++) {
         if (GA[h_a].rstrctd_list[i] != GA[h_b].rstrctd_list[i]) return FALSE;
       }
     }
   } else {
     return FALSE;
   }
   return TRUE;
}